

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O1

void __thiscall
EOServer::Initialize
          (EOServer *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
          *dbinfo,Config *eoserv_config,Config *admin_config)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  World *this_00;
  TimeEvent *pTVar4;
  string *psVar5;
  long lVar6;
  double dVar7;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
  local_f0;
  
  this_00 = (World *)operator_new(0x980);
  lVar6 = 0x10;
  psVar5 = (string *)&local_f0;
  do {
    *(string **)psVar5 = psVar5 + 0x10;
    lVar2 = *(long *)((long)dbinfo->_M_elems + lVar6 + -0x10);
    std::__cxx11::string::_M_construct<char*>
              (psVar5,lVar2,*(long *)((long)dbinfo->_M_elems + lVar6 + -8) + lVar2);
    lVar6 = lVar6 + 0x20;
    psVar5 = psVar5 + 0x20;
  } while (lVar6 != 0xd0);
  World::World(this_00,&local_f0,eoserv_config,admin_config);
  this->world = this_00;
  lVar6 = 0;
  do {
    plVar3 = *(long **)((long)&local_f0._M_elems[5]._M_dataplus._M_p + lVar6);
    plVar1 = (long *)(local_f0._M_elems[5].field_2._M_local_buf + lVar6);
    if (plVar1 != plVar3) {
      operator_delete(plVar3,*plVar1 + 1);
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0xc0);
  pTVar4 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(pTVar4,server_check_hangup,this,1.0,-1);
  Timer::Register(&this->world->timer,pTVar4);
  pTVar4 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(pTVar4,server_pump_queue,this,0.001,-1);
  Timer::Register(&this->world->timer,pTVar4);
  this->world->server = this;
  dVar7 = Timer::GetTime();
  this->start = dVar7;
  UpdateConfig(this);
  return;
}

Assistant:

void EOServer::Initialize(std::array<std::string, 6> dbinfo, const Config &eoserv_config, const Config &admin_config)
{
	this->world = new World(dbinfo, eoserv_config, admin_config);

	TimeEvent *event = new TimeEvent(server_check_hangup, this, 1.0, Timer::FOREVER);
	this->world->timer.Register(event);

	event = new TimeEvent(server_pump_queue, this, 0.001, Timer::FOREVER);
	this->world->timer.Register(event);

	this->world->server = this;

	this->start = Timer::GetTime();

	this->UpdateConfig();
}